

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_24_3_1824b316 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c;
  NodeSetArray *pNVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer pdVar6;
  pointer puVar7;
  size_t sVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  NodeSetArray *pNVar14;
  long lVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  _DistanceType __len;
  int *piVar19;
  NodeSetArray *pNVar20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var21;
  NodeSetArray *pNVar22;
  long lVar23;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var24;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var25;
  ulong uVar26;
  int *piVar27;
  T tmp;
  int local_7c;
  
  c._M_current = end._M_current + -1;
  local_7c = bad_allowed;
LAB_00288203:
  lVar12 = (long)end._M_current - (long)begin._M_current;
  uVar13 = lVar12 >> 2;
  if (0x17 < (long)uVar13) {
    uVar26 = uVar13 >> 1;
    _Var21._M_current = begin._M_current + uVar26;
    if ((long)uVar13 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (_Var21,begin,c,comp);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (begin,_Var21,c,comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar26 - 1)),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (end._M_current + -2),comp);
      piVar19 = begin._M_current + uVar26;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 2),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar19 + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (end._M_current + -3),comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar26 - 1)),_Var21,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar19 + 1),
                 comp);
      iVar4 = *begin._M_current;
      *begin._M_current = *piVar19;
      *piVar19 = iVar4;
    }
    if ((leftmost & 1U) == 0) {
      iVar4 = begin._M_current[-1];
      iVar5 = *begin._M_current;
      pdVar6 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar2 = (comp.this)->feastol;
      if ((pdVar6[iVar4] <= dVar2) || (dVar2 < pdVar6[iVar5])) {
        if ((dVar2 < pdVar6[iVar4]) || (pdVar6[iVar5] <= dVar2)) {
          puVar7 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar7[iVar5] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(comp.this)->inds[iVar5] * 0x38);
          lVar17 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar7[iVar4] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(comp.this)->inds[iVar4] * 0x38);
          if ((lVar15 < lVar17) ||
             ((lVar15 <= lVar17 &&
              (uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
              lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              uVar18 = (ulong)(uint)(comp.this)->inds[iVar5],
              ((uVar18 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
              (uVar18 + 0x42d8680e260ae5b) * lVar15) <
              ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
              (uVar26 + 0x42d8680e260ae5b) * lVar15))))) goto LAB_00288976;
        }
        dVar3 = pdVar6[iVar5];
        pNVar1 = &(comp.nodequeue)->colUpperNodesPtr;
        pNVar14 = &(comp.nodequeue)->colLowerNodesPtr;
        lVar12 = 0;
        do {
          iVar4 = *(c._M_current + lVar12);
          if ((dVar3 <= dVar2) || (dVar2 < pdVar6[iVar4])) {
            if ((dVar3 <= dVar2) && (dVar2 < pdVar6[iVar4])) goto LAB_002893ea;
            puVar7 = ((comp.this)->complementation).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pNVar22 = pNVar1;
            if (puVar7[iVar5] == '\0') {
              pNVar22 = pNVar14;
            }
            pNVar20 = pNVar1;
            if (puVar7[iVar4] == '\0') {
              pNVar20 = pNVar14;
            }
            sVar8 = *(size_t *)
                     ((long)&(pNVar20->_M_t).
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
            sVar9 = *(size_t *)
                     ((long)&(pNVar22->_M_t).
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
            if (((long)sVar9 <= (long)sVar8) &&
               (((long)sVar9 < (long)sVar8 ||
                (uVar26 = (ulong)(uint)(comp.this)->inds[iVar5],
                lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
                lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
                uVar13 = (ulong)(uint)(comp.this)->inds[iVar4],
                ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
                (uVar26 + 0x42d8680e260ae5b) * lVar15) <=
                ((uVar13 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
                (uVar13 + 0x42d8680e260ae5b) * lVar15))))) goto LAB_002893ea;
          }
          lVar12 = lVar12 + -4;
        } while( true );
      }
    }
LAB_00288976:
    iVar4 = *begin._M_current;
    pdVar6 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = (comp.this)->feastol;
    pNVar1 = &(comp.nodequeue)->colUpperNodesPtr;
    pNVar14 = &(comp.nodequeue)->colLowerNodesPtr;
    lVar15 = 0;
    _Var21._M_current = begin._M_current;
    do {
      piVar19 = _Var21._M_current + 1;
      iVar5 = *piVar19;
      if ((pdVar6[iVar5] <= dVar2) || (dVar2 < pdVar6[iVar4])) {
        if ((pdVar6[iVar5] <= dVar2) && (dVar2 < pdVar6[iVar4])) goto LAB_00288aae;
        puVar7 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar22 = pNVar1;
        if (puVar7[iVar5] == '\0') {
          pNVar22 = pNVar14;
        }
        pNVar20 = pNVar1;
        if (puVar7[iVar4] == '\0') {
          pNVar20 = pNVar14;
        }
        sVar8 = *(size_t *)
                 ((long)&(pNVar20->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
        sVar9 = *(size_t *)
                 ((long)&(pNVar22->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
        if (((long)sVar9 <= (long)sVar8) &&
           (((long)sVar9 < (long)sVar8 ||
            (uVar18 = (ulong)(uint)(comp.this)->inds[iVar5],
            lVar17 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar23 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
            ((uVar18 + 0xc8497d2a400d9551) * lVar23 >> 0x20 ^ (uVar18 + 0x42d8680e260ae5b) * lVar17)
            <= ((uVar26 + 0xc8497d2a400d9551) * lVar23 >> 0x20 ^
               (uVar26 + 0x42d8680e260ae5b) * lVar17))))) goto LAB_00288aae;
      }
      lVar15 = lVar15 + -4;
      _Var21._M_current = piVar19;
    } while( true );
  }
  if ((leftmost & 1U) == 0) {
    if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
      pdVar6 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar2 = (comp.this)->feastol;
      pNVar1 = &(comp.nodequeue)->colUpperNodesPtr;
      pNVar14 = &(comp.nodequeue)->colLowerNodesPtr;
      piVar19 = begin._M_current + 1;
      _Var21._M_current = begin._M_current;
LAB_0028863e:
      piVar16 = piVar19;
      iVar4 = _Var21._M_current[1];
      iVar5 = *_Var21._M_current;
      dVar3 = pdVar6[iVar4];
      if ((dVar2 < dVar3) && (pdVar6[iVar5] <= dVar2)) {
LAB_002886ce:
        do {
          piVar19 = _Var21._M_current;
          _Var21._M_current = piVar19 + -1;
          piVar19[1] = *piVar19;
          iVar5 = piVar19[-1];
          if (dVar2 < dVar3) {
            if (pdVar6[iVar5] <= dVar2) goto LAB_002886ce;
          }
          if ((dVar3 <= dVar2) && (dVar2 < pdVar6[iVar5])) goto LAB_002887cb;
          puVar7 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar22 = pNVar1;
          if (puVar7[iVar4] == '\0') {
            pNVar22 = pNVar14;
          }
          pNVar20 = pNVar1;
          if (puVar7[iVar5] == '\0') {
            pNVar20 = pNVar14;
          }
          sVar8 = *(size_t *)
                   ((long)&(pNVar20->_M_t).
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
          sVar9 = *(size_t *)
                   ((long)&(pNVar22->_M_t).
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
          if (((long)sVar9 <= (long)sVar8) &&
             (((long)sVar9 < (long)sVar8 ||
              (uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
              lVar12 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              uVar13 = (ulong)(uint)(comp.this)->inds[iVar5],
              ((uVar26 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              (uVar26 + 0x42d8680e260ae5b) * lVar12) <=
              ((uVar13 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              (uVar13 + 0x42d8680e260ae5b) * lVar12))))) goto LAB_002887cb;
        } while( true );
      }
      if ((dVar2 < dVar3) || (pdVar6[iVar5] <= dVar2)) {
        puVar7 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar22 = pNVar1;
        if (puVar7[iVar4] == '\0') {
          pNVar22 = pNVar14;
        }
        pNVar20 = pNVar1;
        if (puVar7[iVar5] == '\0') {
          pNVar20 = pNVar14;
        }
        sVar8 = *(size_t *)
                 ((long)&(pNVar20->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
        sVar9 = *(size_t *)
                 ((long)&(pNVar22->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
        if (((long)sVar8 < (long)sVar9) ||
           (((long)sVar8 <= (long)sVar9 &&
            (uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
            lVar12 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            uVar13 = (ulong)(uint)(comp.this)->inds[iVar5],
            ((uVar13 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar13 + 0x42d8680e260ae5b) * lVar12)
            < ((uVar26 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              (uVar26 + 0x42d8680e260ae5b) * lVar12))))) goto LAB_002886ce;
      }
      goto LAB_002887db;
    }
LAB_0028888c:
    bVar10 = true;
  }
  else {
    if ((begin._M_current == end._M_current) ||
       (piVar19 = begin._M_current + 1, piVar19 == end._M_current)) goto LAB_0028888c;
    pdVar6 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = (comp.this)->feastol;
    pNVar1 = &(comp.nodequeue)->colUpperNodesPtr;
    pNVar14 = &(comp.nodequeue)->colLowerNodesPtr;
    lVar12 = 0;
    _Var21._M_current = begin._M_current;
    do {
      iVar4 = *piVar19;
      iVar5 = *_Var21._M_current;
      dVar3 = pdVar6[iVar4];
      if ((dVar3 <= dVar2) || (dVar2 < pdVar6[iVar5])) {
        if ((dVar2 < dVar3) || (pdVar6[iVar5] <= dVar2)) {
          puVar7 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar22 = pNVar1;
          if (puVar7[iVar4] == '\0') {
            pNVar22 = pNVar14;
          }
          pNVar20 = pNVar1;
          if (puVar7[iVar5] == '\0') {
            pNVar20 = pNVar14;
          }
          sVar8 = *(size_t *)
                   ((long)&(pNVar20->_M_t).
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
          sVar9 = *(size_t *)
                   ((long)&(pNVar22->_M_t).
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
          if (((long)sVar8 < (long)sVar9) ||
             (((long)sVar8 <= (long)sVar9 &&
              (uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
              lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              uVar13 = (ulong)(uint)(comp.this)->inds[iVar5],
              ((uVar13 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
              (uVar13 + 0x42d8680e260ae5b) * lVar15) <
              ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
              (uVar26 + 0x42d8680e260ae5b) * lVar15))))) goto LAB_00288315;
        }
      }
      else {
LAB_00288315:
        piVar16 = piVar19 + -1;
        *piVar19 = iVar5;
        if (piVar16 != begin._M_current) {
          lVar15 = 0;
          do {
            iVar5 = *(_Var21._M_current + lVar15 + -4);
            if ((dVar3 <= dVar2) || (dVar2 < pdVar6[iVar5])) {
              if ((dVar3 <= dVar2) && (dVar2 < pdVar6[iVar5])) break;
              puVar7 = ((comp.this)->complementation).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pNVar22 = pNVar1;
              if (puVar7[iVar4] == '\0') {
                pNVar22 = pNVar14;
              }
              pNVar20 = pNVar1;
              if (puVar7[iVar5] == '\0') {
                pNVar20 = pNVar14;
              }
              sVar8 = *(size_t *)
                       ((long)&(pNVar20->_M_t).
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                               ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
              sVar9 = *(size_t *)
                       ((long)&(pNVar22->_M_t).
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                               ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
              if (((long)sVar9 <= (long)sVar8) &&
                 (((long)sVar9 < (long)sVar8 ||
                  (uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
                  lVar17 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
                  lVar23 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
                  uVar13 = (ulong)(uint)(comp.this)->inds[iVar5],
                  ((uVar26 + 0xc8497d2a400d9551) * lVar23 >> 0x20 ^
                  (uVar26 + 0x42d8680e260ae5b) * lVar17) <=
                  ((uVar13 + 0xc8497d2a400d9551) * lVar23 >> 0x20 ^
                  (uVar13 + 0x42d8680e260ae5b) * lVar17))))) goto LAB_00288470;
            }
            piVar16 = piVar16 + -1;
            *(_Var21._M_current + lVar15) = iVar5;
            lVar15 = lVar15 + -4;
          } while (lVar12 != lVar15);
          piVar16 = lVar15 + _Var21._M_current;
        }
LAB_00288470:
        *piVar16 = iVar4;
      }
      piVar19 = piVar19 + 1;
      _Var21._M_current = _Var21._M_current + 1;
      lVar12 = lVar12 + -4;
    } while (piVar19 != end._M_current);
LAB_00289118:
    bVar10 = true;
  }
  goto LAB_002898b8;
LAB_002893ea:
  piVar19 = c._M_current + lVar12;
  _Var21._M_current = begin._M_current;
  if (lVar12 == 0) {
joined_r0x00289564:
    if (_Var21._M_current < piVar19) {
      while( true ) {
        _Var21._M_current = _Var21._M_current + 1;
        iVar4 = *_Var21._M_current;
        if ((dVar2 < dVar3) && (pdVar6[iVar4] <= dVar2)) goto LAB_00289889;
        if ((dVar3 <= dVar2) && (dVar2 < pdVar6[iVar4])) break;
        puVar7 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar22 = pNVar1;
        if (puVar7[iVar5] == '\0') {
          pNVar22 = pNVar14;
        }
        pNVar20 = pNVar1;
        if (puVar7[iVar4] == '\0') {
          pNVar20 = pNVar14;
        }
        sVar8 = *(size_t *)
                 ((long)&(pNVar20->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
        sVar9 = *(size_t *)
                 ((long)&(pNVar22->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
        if ((long)sVar8 < (long)sVar9) goto LAB_00289889;
        if ((long)sVar9 < (long)sVar8) break;
        if ((piVar19 <= _Var21._M_current) ||
           (uVar26 = (ulong)(uint)(comp.this)->inds[iVar5],
           lVar12 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
           lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
           uVar13 = (ulong)(uint)(comp.this)->inds[iVar4],
           ((uVar13 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar13 + 0x42d8680e260ae5b) * lVar12)
           < ((uVar26 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar12
             ))) goto LAB_00289889;
      }
      goto joined_r0x00289564;
    }
  }
  else {
    while( true ) {
      _Var21._M_current = _Var21._M_current + 1;
      iVar4 = *_Var21._M_current;
      if ((dVar2 < dVar3) && (pdVar6[iVar4] <= dVar2)) break;
      if ((dVar2 < dVar3) || (pdVar6[iVar4] <= dVar2)) {
        puVar7 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar22 = pNVar1;
        if (puVar7[iVar5] == '\0') {
          pNVar22 = pNVar14;
        }
        pNVar20 = pNVar1;
        if (puVar7[iVar4] == '\0') {
          pNVar20 = pNVar14;
        }
        sVar8 = *(size_t *)
                 ((long)&(pNVar20->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
        sVar9 = *(size_t *)
                 ((long)&(pNVar22->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
        if (((long)sVar8 < (long)sVar9) ||
           (((long)sVar8 <= (long)sVar9 &&
            (uVar26 = (ulong)(uint)(comp.this)->inds[iVar5],
            lVar12 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            uVar13 = (ulong)(uint)(comp.this)->inds[iVar4],
            ((uVar13 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar13 + 0x42d8680e260ae5b) * lVar12)
            < ((uVar26 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              (uVar26 + 0x42d8680e260ae5b) * lVar12))))) break;
      }
    }
  }
LAB_00289889:
  if (_Var21._M_current < piVar19) {
    iVar4 = *_Var21._M_current;
    *_Var21._M_current = *piVar19;
    *piVar19 = iVar4;
LAB_00289696:
    do {
      piVar19 = piVar19 + -1;
      iVar4 = *piVar19;
      if (dVar2 < dVar3) {
        if (pdVar6[iVar4] <= dVar2) goto LAB_00289696;
      }
      if ((dVar3 <= dVar2) && (dVar2 < pdVar6[iVar4])) goto LAB_00289790;
      puVar7 = ((comp.this)->complementation).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar22 = pNVar1;
      if (puVar7[iVar5] == '\0') {
        pNVar22 = pNVar14;
      }
      pNVar20 = pNVar1;
      if (puVar7[iVar4] == '\0') {
        pNVar20 = pNVar14;
      }
      sVar8 = *(size_t *)
               ((long)&(pNVar20->_M_t).
                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                       .
                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
      sVar9 = *(size_t *)
               ((long)&(pNVar22->_M_t).
                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                       .
                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
      if (((long)sVar9 <= (long)sVar8) &&
         (((long)sVar9 < (long)sVar8 ||
          (uVar26 = (ulong)(uint)(comp.this)->inds[iVar5],
          lVar12 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
          lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
          uVar13 = (ulong)(uint)(comp.this)->inds[iVar4],
          ((uVar26 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar12)
          <= ((uVar13 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar13 + 0x42d8680e260ae5b) * lVar12
             ))))) goto LAB_00289790;
    } while( true );
  }
  *begin._M_current = *piVar19;
  *piVar19 = iVar5;
  bVar10 = false;
  begin._M_current = piVar19 + 1;
  goto LAB_002898b8;
LAB_00289790:
  _Var21._M_current = _Var21._M_current + 1;
  iVar4 = *_Var21._M_current;
  if ((dVar2 < dVar3) && (pdVar6[iVar4] <= dVar2)) goto LAB_00289889;
  if ((dVar2 < dVar3) || (pdVar6[iVar4] <= dVar2)) {
    puVar7 = ((comp.this)->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar22 = pNVar1;
    if (puVar7[iVar5] == '\0') {
      pNVar22 = pNVar14;
    }
    pNVar20 = pNVar1;
    if (puVar7[iVar4] == '\0') {
      pNVar20 = pNVar14;
    }
    sVar8 = *(size_t *)
             ((long)&(pNVar20->_M_t).
                     super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                     .
                     super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                     ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
    sVar9 = *(size_t *)
             ((long)&(pNVar22->_M_t).
                     super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                     .
                     super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                     ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
    if (((long)sVar8 < (long)sVar9) ||
       (((long)sVar8 <= (long)sVar9 &&
        (uVar26 = (ulong)(uint)(comp.this)->inds[iVar5],
        lVar12 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
        lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
        uVar13 = (ulong)(uint)(comp.this)->inds[iVar4],
        ((uVar13 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar13 + 0x42d8680e260ae5b) * lVar12) <
        ((uVar26 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar12)))))
    goto LAB_00289889;
  }
  goto LAB_00289790;
LAB_00288aae:
  _Var25._M_current = c._M_current;
  if (lVar15 == 0) {
    _Var24._M_current = c._M_current;
    _Var25._M_current = end._M_current;
    if (piVar19 < end._M_current) {
      while( true ) {
        iVar5 = *_Var24._M_current;
        _Var25._M_current = _Var24._M_current;
        if ((dVar2 < pdVar6[iVar5]) && (pdVar6[iVar4] <= dVar2)) break;
        if ((dVar2 < pdVar6[iVar5]) || (pdVar6[iVar4] <= dVar2)) {
          puVar7 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar22 = pNVar1;
          if (puVar7[iVar5] == '\0') {
            pNVar22 = pNVar14;
          }
          pNVar20 = pNVar1;
          if (puVar7[iVar4] == '\0') {
            pNVar20 = pNVar14;
          }
          sVar8 = *(size_t *)
                   ((long)&(pNVar20->_M_t).
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
          sVar9 = *(size_t *)
                   ((long)&(pNVar22->_M_t).
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
          if ((long)sVar8 < (long)sVar9) break;
          if ((long)sVar9 < (long)sVar8) goto LAB_00288c52;
          if ((_Var24._M_current <= piVar19) ||
             (uVar18 = (ulong)(uint)(comp.this)->inds[iVar5],
             lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
             lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
             uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
             ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar15
             ) < ((uVar18 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
                 (uVar18 + 0x42d8680e260ae5b) * lVar15))) break;
        }
        else {
LAB_00288c52:
          if (_Var24._M_current <= piVar19) break;
        }
        _Var24._M_current = _Var24._M_current + -1;
      }
    }
  }
  else {
    while( true ) {
      iVar5 = *_Var25._M_current;
      if ((dVar2 < pdVar6[iVar5]) && (pdVar6[iVar4] <= dVar2)) break;
      if ((dVar2 < pdVar6[iVar5]) || (pdVar6[iVar4] <= dVar2)) {
        puVar7 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar22 = pNVar1;
        if (puVar7[iVar5] == '\0') {
          pNVar22 = pNVar14;
        }
        pNVar20 = pNVar1;
        if (puVar7[iVar4] == '\0') {
          pNVar20 = pNVar14;
        }
        sVar8 = *(size_t *)
                 ((long)&(pNVar20->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
        sVar9 = *(size_t *)
                 ((long)&(pNVar22->_M_t).
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
        if (((long)sVar8 < (long)sVar9) ||
           (((long)sVar8 <= (long)sVar9 &&
            (uVar18 = (ulong)(uint)(comp.this)->inds[iVar5],
            lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
            ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar15)
            < ((uVar18 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^
              (uVar18 + 0x42d8680e260ae5b) * lVar15))))) break;
      }
      _Var25._M_current = _Var25._M_current + -1;
    }
  }
  piVar16 = piVar19;
  piVar27 = _Var25._M_current;
  if (piVar19 < _Var25._M_current) {
LAB_00288d0c:
    iVar5 = *piVar16;
    *piVar16 = *piVar27;
    *piVar27 = iVar5;
LAB_00288d1b:
    do {
      _Var21._M_current = piVar16;
      piVar16 = _Var21._M_current + 1;
      iVar5 = *piVar16;
      if (dVar2 < pdVar6[iVar5]) {
        if (pdVar6[iVar4] <= dVar2) goto LAB_00288d1b;
      }
      if ((pdVar6[iVar5] <= dVar2) && (dVar2 < pdVar6[iVar4])) goto LAB_00288e11;
      puVar7 = ((comp.this)->complementation).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar22 = pNVar1;
      if (puVar7[iVar5] == '\0') {
        pNVar22 = pNVar14;
      }
      pNVar20 = pNVar1;
      if (puVar7[iVar4] == '\0') {
        pNVar20 = pNVar14;
      }
      sVar8 = *(size_t *)
               ((long)&(pNVar20->_M_t).
                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                       .
                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
      sVar9 = *(size_t *)
               ((long)&(pNVar22->_M_t).
                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                       .
                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
      if (((long)sVar9 <= (long)sVar8) &&
         (((long)sVar9 < (long)sVar8 ||
          (uVar18 = (ulong)(uint)(comp.this)->inds[iVar5],
          lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
          lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
          uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
          ((uVar18 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^ (uVar18 + 0x42d8680e260ae5b) * lVar15)
          <= ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar15
             ))))) goto LAB_00288e11;
    } while( true );
  }
LAB_00288f2e:
  *begin._M_current = *_Var21._M_current;
  *_Var21._M_current = iVar4;
  uVar18 = (long)_Var21._M_current - (long)begin._M_current >> 2;
  _Var24._M_current = _Var21._M_current + 1;
  uVar26 = (long)end._M_current - (long)_Var24._M_current >> 2;
  if (((long)uVar18 < (long)(uVar13 >> 3)) || ((long)uVar26 < (long)(uVar13 >> 3))) {
    local_7c = local_7c + -1;
    if (local_7c == 0) {
      lVar15 = (long)((uVar13 - ((long)(uVar13 - 2) >> 0x3f)) + -2) >> 1;
      do {
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__2>>
                  (begin,lVar15,uVar13,begin._M_current[lVar15],
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:86:13)>
                    )comp);
        bVar10 = lVar15 != 0;
        lVar15 = lVar15 + -1;
        _Var21._M_current = c._M_current;
      } while (bVar10);
      while (4 < lVar12) {
        iVar4 = *_Var21._M_current;
        *_Var21._M_current = *begin._M_current;
        lVar12 = lVar12 + -4;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__2>>
                  (begin,0,lVar12 >> 2,iVar4,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:86:13)>
                    )comp);
        _Var21._M_current = _Var21._M_current + -1;
      }
      local_7c = 0;
      bVar10 = true;
      goto LAB_002898b8;
    }
    if (0x17 < (long)uVar18) {
      uVar13 = uVar18 & 0xfffffffffffffffc;
      iVar4 = *begin._M_current;
      *begin._M_current = *(begin._M_current + uVar13);
      *(begin._M_current + uVar13) = iVar4;
      iVar4 = _Var21._M_current[-1];
      _Var21._M_current[-1] = *(_Var21._M_current - uVar13);
      *(_Var21._M_current - uVar13) = iVar4;
      if (0x80 < (long)uVar18) {
        uVar18 = uVar18 >> 2;
        iVar4 = begin._M_current[1];
        begin._M_current[1] = begin._M_current[uVar18 + 1];
        begin._M_current[uVar18 + 1] = iVar4;
        iVar4 = begin._M_current[2];
        begin._M_current[2] = begin._M_current[uVar18 + 2];
        begin._M_current[uVar18 + 2] = iVar4;
        iVar4 = _Var21._M_current[-2];
        _Var21._M_current[-2] = _Var21._M_current[~uVar18];
        _Var21._M_current[~uVar18] = iVar4;
        iVar4 = _Var21._M_current[-3];
        _Var21._M_current[-3] = _Var21._M_current[-2 - uVar18];
        _Var21._M_current[-2 - uVar18] = iVar4;
      }
    }
    if (0x17 < (long)uVar26) {
      iVar4 = _Var21._M_current[1];
      uVar13 = uVar26 & 0xfffffffffffffffc;
      _Var21._M_current[1] = *(uVar13 + 4 + _Var21._M_current);
      *(uVar13 + 4 + _Var21._M_current) = iVar4;
      iVar4 = end._M_current[-1];
      end._M_current[-1] = *(end._M_current - uVar13);
      *(end._M_current - uVar13) = iVar4;
      if (0x80 < (long)uVar26) {
        uVar26 = uVar26 >> 2;
        iVar4 = _Var21._M_current[2];
        _Var21._M_current[2] = _Var21._M_current[uVar26 + 2];
        _Var21._M_current[uVar26 + 2] = iVar4;
        iVar4 = _Var21._M_current[3];
        _Var21._M_current[3] = _Var21._M_current[uVar26 + 3];
        _Var21._M_current[uVar26 + 3] = iVar4;
        iVar4 = end._M_current[-2];
        end._M_current[-2] = end._M_current[~uVar26];
        end._M_current[~uVar26] = iVar4;
        iVar4 = end._M_current[-3];
        end._M_current[-3] = end._M_current[-2 - uVar26];
        end._M_current[-2 - uVar26] = iVar4;
      }
    }
  }
  else if ((_Var25._M_current <= piVar19) &&
          (bVar10 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                              (begin,_Var21,comp), bVar10)) {
    bVar11 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                       (_Var24,end,comp);
    bVar10 = true;
    if (bVar11) goto LAB_002898b8;
  }
  pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
            (begin,_Var21,comp,local_7c,(bool)(leftmost & 1));
  bVar10 = false;
  leftmost = false;
  begin._M_current = _Var24._M_current;
LAB_002898b8:
  if (bVar10) {
    return;
  }
  goto LAB_00288203;
LAB_00288e11:
  piVar27 = piVar27 + -1;
  iVar5 = *piVar27;
  if ((dVar2 < pdVar6[iVar5]) && (pdVar6[iVar4] <= dVar2)) goto LAB_00288f07;
  if ((dVar2 < pdVar6[iVar5]) || (pdVar6[iVar4] <= dVar2)) {
    puVar7 = ((comp.this)->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar22 = pNVar1;
    if (puVar7[iVar5] == '\0') {
      pNVar22 = pNVar14;
    }
    pNVar20 = pNVar1;
    if (puVar7[iVar4] == '\0') {
      pNVar20 = pNVar14;
    }
    sVar8 = *(size_t *)
             ((long)&(pNVar20->_M_t).
                     super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                     .
                     super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                     ._M_head_impl[(comp.this)->inds[iVar4]]._M_t._M_impl + 0x30);
    sVar9 = *(size_t *)
             ((long)&(pNVar22->_M_t).
                     super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                     .
                     super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                     ._M_head_impl[(comp.this)->inds[iVar5]]._M_t._M_impl + 0x30);
    if (((long)sVar8 < (long)sVar9) ||
       (((long)sVar8 <= (long)sVar9 &&
        (uVar18 = (ulong)(uint)(comp.this)->inds[iVar5],
        lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
        lVar17 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
        uVar26 = (ulong)(uint)(comp.this)->inds[iVar4],
        ((uVar26 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^ (uVar26 + 0x42d8680e260ae5b) * lVar15) <
        ((uVar18 + 0xc8497d2a400d9551) * lVar17 >> 0x20 ^ (uVar18 + 0x42d8680e260ae5b) * lVar15)))))
    goto LAB_00288f07;
  }
  goto LAB_00288e11;
LAB_00288f07:
  if (piVar27 <= piVar16) goto LAB_00288f2e;
  goto LAB_00288d0c;
LAB_002887cb:
  *piVar19 = iVar4;
LAB_002887db:
  piVar19 = piVar16 + 1;
  _Var21._M_current = piVar16;
  if (piVar19 == end._M_current) goto LAB_00289118;
  goto LAB_0028863e;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }